

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O3

int __thiscall brown::App::runGraphics(App *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = appInit(this);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (this->isBreak == false) {
      do {
        appEventHandle(this);
        iVar1 = beginDraw(this);
        if (iVar1 == 0) {
          Simulator::renderLoop(this->sim,&this->dd);
        }
        endDraw(this);
        SDL_Delay(0x1e);
      } while (this->isBreak != true);
    }
    appExit(this);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int App::runGraphics() {
    if (appInit() != 0) {return -1;}
    while (!isBreak) {
        appEventHandle();
        if (beginDraw() == 0) {
            sim.renderLoop(dd);
        }
        endDraw();
        SDL_Delay(30);
    }
    appExit();
    return 0;
}